

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[12],std::__cxx11::string&,char_const(&)[37],std::__cxx11::string_const&,char_const(&)[16]>
                   (string *__return_storage_ptr__,char (*a) [12],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [37],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [16])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  size_t local_78;
  char (*local_70) [37];
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [16];
  undefined8 local_38;
  
  local_a8.first._M_len = strlen(*a);
  local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88 = (b->_M_dataplus)._M_p;
  local_90 = b->_M_string_length;
  local_80 = 0;
  local_a8.first._M_str = *a;
  local_78 = strlen(*args);
  local_68 = 0;
  local_58 = (args_1->_M_dataplus)._M_p;
  local_60 = args_1->_M_string_length;
  local_50 = 0;
  local_70 = args;
  local_48 = strlen(*args_2);
  local_38 = 0;
  views._M_len = 5;
  views._M_array = &local_a8;
  local_40 = args_2;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}